

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arrowhead.cpp
# Opt level: O0

void __thiscall agg::arrowhead::rewind(arrowhead *this,FILE *__stream)

{
  uint uVar1;
  uint path_id_local;
  arrowhead *this_local;
  
  uVar1 = (uint)__stream;
  this->m_curr_id = uVar1;
  this->m_curr_coord = 0;
  if (uVar1 == 0) {
    if ((this->m_tail_flag & 1U) == 0) {
      this->m_cmd[0] = 0;
    }
    else {
      this->m_coord[0] = this->m_tail_d1;
      this->m_coord[1] = 0.0;
      this->m_coord[2] = this->m_tail_d1 - this->m_tail_d4;
      this->m_coord[3] = this->m_tail_d3;
      this->m_coord[4] = -this->m_tail_d2 - this->m_tail_d4;
      this->m_coord[5] = this->m_tail_d3;
      this->m_coord[6] = -this->m_tail_d2;
      this->m_coord[7] = 0.0;
      this->m_coord[8] = -this->m_tail_d2 - this->m_tail_d4;
      this->m_coord[9] = -this->m_tail_d3;
      this->m_coord[10] = this->m_tail_d1 - this->m_tail_d4;
      this->m_coord[0xb] = -this->m_tail_d3;
      this->m_cmd[0] = 1;
      this->m_cmd[1] = 2;
      this->m_cmd[2] = 2;
      this->m_cmd[3] = 2;
      this->m_cmd[4] = 2;
      this->m_cmd[5] = 2;
      this->m_cmd[7] = 0x5f;
      this->m_cmd[6] = 0;
    }
  }
  else if (uVar1 == 1) {
    if ((this->m_head_flag & 1U) == 0) {
      this->m_cmd[0] = 0;
    }
    else {
      this->m_coord[0] = -this->m_head_d1;
      this->m_coord[1] = 0.0;
      this->m_coord[2] = this->m_head_d2 + this->m_head_d4;
      this->m_coord[3] = -this->m_head_d3;
      this->m_coord[4] = this->m_head_d2;
      this->m_coord[5] = 0.0;
      this->m_coord[6] = this->m_head_d2 + this->m_head_d4;
      this->m_coord[7] = this->m_head_d3;
      this->m_cmd[0] = 1;
      this->m_cmd[1] = 2;
      this->m_cmd[2] = 2;
      this->m_cmd[3] = 2;
      this->m_cmd[4] = 0x5f;
      this->m_cmd[5] = 0;
    }
  }
  return;
}

Assistant:

void arrowhead::rewind(unsigned path_id)
    {
        m_curr_id = path_id;
        m_curr_coord = 0;
        if(path_id == 0)
        {
            if(!m_tail_flag)
            {
                m_cmd[0] = path_cmd_stop;
                return;
            }
            m_coord[0]  =  m_tail_d1;             m_coord[1]  =  0.0;
            m_coord[2]  =  m_tail_d1 - m_tail_d4; m_coord[3]  =  m_tail_d3;
            m_coord[4]  = -m_tail_d2 - m_tail_d4; m_coord[5]  =  m_tail_d3;
            m_coord[6]  = -m_tail_d2;             m_coord[7]  =  0.0;
            m_coord[8]  = -m_tail_d2 - m_tail_d4; m_coord[9]  = -m_tail_d3;
            m_coord[10] =  m_tail_d1 - m_tail_d4; m_coord[11] = -m_tail_d3;

            m_cmd[0] = path_cmd_move_to;
            m_cmd[1] = path_cmd_line_to;
            m_cmd[2] = path_cmd_line_to;
            m_cmd[3] = path_cmd_line_to;
            m_cmd[4] = path_cmd_line_to;
            m_cmd[5] = path_cmd_line_to;
            m_cmd[7] = path_cmd_end_poly | path_flags_close | path_flags_ccw;
            m_cmd[6] = path_cmd_stop;
            return;
        }

        if(path_id == 1)
        {
            if(!m_head_flag)
            {
                m_cmd[0] = path_cmd_stop;
                return;
            }
            m_coord[0]  = -m_head_d1;            m_coord[1]  = 0.0;
            m_coord[2]  = m_head_d2 + m_head_d4; m_coord[3]  = -m_head_d3;
            m_coord[4]  = m_head_d2;             m_coord[5]  = 0.0;
            m_coord[6]  = m_head_d2 + m_head_d4; m_coord[7]  = m_head_d3;

            m_cmd[0] = path_cmd_move_to;
            m_cmd[1] = path_cmd_line_to;
            m_cmd[2] = path_cmd_line_to;
            m_cmd[3] = path_cmd_line_to;
            m_cmd[4] = path_cmd_end_poly | path_flags_close | path_flags_ccw;
            m_cmd[5] = path_cmd_stop;
            return;
        }
    }